

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_utils.hpp
# Opt level: O0

string * vector_utils::to_string<volume_mapping>
                   (string *__return_storage_ptr__,
                   vector<volume_mapping,_std::allocator<volume_mapping>_> *array)

{
  undefined8 this;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_78;
  reference local_58;
  volume_mapping *x;
  const_iterator __end0;
  const_iterator __begin0;
  vector<volume_mapping,_std::allocator<volume_mapping>_> *__range2;
  string res;
  vector<volume_mapping,_std::allocator<volume_mapping>_> *array_local;
  
  res.field_2._8_8_ = array;
  std::__cxx11::string::string((string *)&__range2);
  this = res.field_2._8_8_;
  __end0 = std::vector<volume_mapping,_std::allocator<volume_mapping>_>::begin
                     ((vector<volume_mapping,_std::allocator<volume_mapping>_> *)res.field_2._8_8_);
  x = (volume_mapping *)
      std::vector<volume_mapping,_std::allocator<volume_mapping>_>::end
                ((vector<volume_mapping,_std::allocator<volume_mapping>_> *)this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_volume_mapping_*,_std::vector<volume_mapping,_std::allocator<volume_mapping>_>_>
                                *)&x);
    if (!bVar1) break;
    local_58 = __gnu_cxx::
               __normal_iterator<const_volume_mapping_*,_std::vector<volume_mapping,_std::allocator<volume_mapping>_>_>
               ::operator*(&__end0);
    volume_mapping::to_string_abi_cxx11_(&local_78,local_58);
    std::__cxx11::string::operator+=((string *)&__range2,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    __gnu_cxx::
    __normal_iterator<const_volume_mapping_*,_std::vector<volume_mapping,_std::allocator<volume_mapping>_>_>
    ::operator++(&__end0);
  }
  std::operator+(&local_a8,"[ ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2);
  std::operator+(__return_storage_ptr__,&local_a8,"]");
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&__range2);
  return __return_storage_ptr__;
}

Assistant:

static string to_string(const vector<T>& array) {
    string res;
    for (auto& x : array) {
      res += x.to_string();
    }
    return "[ " + res + "]";
  }